

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

double evaluate_MFE(vector<int,_std::allocator<int>_> *rna,string *bp)

{
  int iVar1;
  ZukerAlgorithm Zu;
  ZukerAlgorithm local_138;
  
  ZukerAlgorithm::ZukerAlgorithm
            (&local_138,rna,
             (int)((ulong)((long)(rna->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(rna->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 2));
  iVar1 = ZukerAlgorithm::calculate_W(&local_138);
  if (bp->_M_string_length != 0) {
    ZukerAlgorithm::traceback_2(&local_138);
    ZukerAlgorithm::get_bp(&local_138,bp);
  }
  ZukerAlgorithm::~ZukerAlgorithm(&local_138);
  return (double)iVar1;
}

Assistant:

double evaluate_MFE(vector<int> & rna, string & bp) {
    int l = int(rna.size());
    ZukerAlgorithm Zu = ZukerAlgorithm(rna,l);
    double mfe = Zu.calculate_W();
    if (!bp.empty()) {
        Zu.traceback_2();
        Zu.get_bp(bp);
    }
    return mfe;

}